

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O0

int tr_tcp_send(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  tr_tcp_socket *tmp_1;
  tr_tcp_socket *tmp;
  int rtval;
  tr_tcp_socket *tcp_socket;
  time_t timeout_local;
  size_t len_local;
  void *pdu_local;
  void *tr_tcp_sock_local;
  time_t local_20;
  timeval t;
  
  t.tv_usec = *(__suseconds_t *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    sVar4 = send(*tr_tcp_sock,pdu,len,0x40);
    tmp._4_4_ = (int)sVar4;
  }
  else {
    t.tv_sec = 0;
    local_20 = timeout;
    iVar3 = setsockopt(*tr_tcp_sock,1,0x15,&local_20,0x10);
    if (iVar3 == -1) {
      uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
      uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      lrtr_dbg("TCP Transport(%s:%s): setting SO_SNDTIMEO failed, %s",uVar1,uVar2,pcVar6);
      tr_tcp_sock_local._4_4_ = -1;
      goto LAB_0010c5f5;
    }
    sVar4 = send(*tr_tcp_sock,pdu,len,0);
    tmp._4_4_ = (int)sVar4;
  }
  if (tmp._4_4_ == -1) {
    piVar5 = __errno_location();
    if (*piVar5 != 0xb) {
      piVar5 = __errno_location();
      if (*piVar5 != 0xb) {
        piVar5 = __errno_location();
        if (*piVar5 == 4) {
          tr_tcp_sock_local._4_4_ = -3;
        }
        else {
          uVar1 = *(undefined8 *)((long)tr_tcp_sock + 8);
          uVar2 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          lrtr_dbg("TCP Transport(%s:%s): send(..) error: %s",uVar1,uVar2,pcVar6);
          tr_tcp_sock_local._4_4_ = -1;
        }
        goto LAB_0010c5f5;
      }
    }
    tr_tcp_sock_local._4_4_ = -2;
  }
  else if (tmp._4_4_ == 0) {
    tr_tcp_sock_local._4_4_ = -1;
  }
  else {
    tr_tcp_sock_local._4_4_ = tmp._4_4_;
  }
LAB_0010c5f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == t.tv_usec) {
    return tr_tcp_sock_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int tr_tcp_send(const void *tr_tcp_sock, const void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = send(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_SNDTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_SNDTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = send(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("send(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_ERROR;
	return rtval;
}